

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

TValue * luaH_newkey(lua_State *L,Table *t,TValue *key)

{
  Node *__src;
  TValue *pTVar1;
  TValue *io1;
  TValue *io2;
  Node *n;
  Node *othern;
  Node *mp;
  TValue *key_local;
  Table *t_local;
  lua_State *L_local;
  
  if (key->tt_ == 0) {
    luaG_runerror(L,"table index is nil");
  }
  if ((key->tt_ == 3) &&
     (((key->value_).n != (key->value_).n || (NAN((key->value_).n) || NAN((key->value_).n))))) {
    luaG_runerror(L,"table index is NaN");
  }
  __src = mainposition(t,key);
  if (((__src->i_val).tt_ != 0) || (othern = __src, __src == &dummynode_)) {
    othern = getfreepos(t);
    if (othern == (Node *)0x0) {
      rehash(L,t,key);
      pTVar1 = luaH_set(L,t,key);
      return pTVar1;
    }
    n = mainposition(t,&(__src->i_key).tvk);
    if (n == __src) {
      (othern->i_key).nk.next = (__src->i_key).nk.next;
      (__src->i_key).nk.next = othern;
    }
    else {
      for (; (n->i_key).nk.next != __src; n = (n->i_key).nk.next) {
      }
      (n->i_key).nk.next = othern;
      memcpy(othern,__src,0x28);
      (__src->i_key).nk.next = (Node *)0x0;
      (__src->i_val).tt_ = 0;
      othern = __src;
    }
  }
  (othern->i_key).nk.value_ = key->value_;
  (othern->i_key).nk.tt_ = key->tt_;
  if ((((key->tt_ & 0x40U) != 0) && (((byte)(key->value_).f[9] & 3) != 0)) && ((t->marked & 4) != 0)
     ) {
    luaC_barrierback_(L,(GCObject *)t);
  }
  return &othern->i_val;
}

Assistant:

TValue *luaH_newkey (lua_State *L, Table *t, const TValue *key) {
  Node *mp;
  if (ttisnil(key)) luaG_runerror(L, "table index is nil");
  else if (ttisnumber(key) && luai_numisnan(L, nvalue(key)))
    luaG_runerror(L, "table index is NaN");
  mp = mainposition(t, key);
  if (!ttisnil(gval(mp)) || isdummy(mp)) {  /* main position is taken? */
    Node *othern;
    Node *n = getfreepos(t);  /* get a free place */
    if (n == NULL) {  /* cannot find a free place? */
      rehash(L, t, key);  /* grow table */
      /* whatever called 'newkey' take care of TM cache and GC barrier */
      return luaH_set(L, t, key);  /* insert key into grown table */
    }
    lua_assert(!isdummy(n));
    othern = mainposition(t, gkey(mp));
    if (othern != mp) {  /* is colliding node out of its main position? */
      /* yes; move colliding node into free position */
      while (gnext(othern) != mp) othern = gnext(othern);  /* find previous */
      gnext(othern) = n;  /* redo the chain with `n' in place of `mp' */
      *n = *mp;  /* copy colliding node into free pos. (mp->next also goes) */
      gnext(mp) = NULL;  /* now `mp' is free */
      setnilvalue(gval(mp));
    }
    else {  /* colliding node is in its own main position */
      /* new node will go into free position */
      gnext(n) = gnext(mp);  /* chain new position */
      gnext(mp) = n;
      mp = n;
    }
  }
  setobj2t(L, gkey(mp), key);
  luaC_barrierback(L, obj2gco(t), key);
  lua_assert(ttisnil(gval(mp)));
  return gval(mp);
}